

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifticdf.c
# Opt level: O0

pqpair student_s2pq(double xx,double dof)

{
  pqpair pVar1;
  double local_58;
  double bound;
  double xlam;
  double s;
  double q;
  double p;
  int status;
  int which;
  double dof_local;
  double xx_local;
  pqpair pq;
  
  xx_local = 0.0;
  pq.p = 1.0;
  p._4_4_ = 1;
  q = 0.0;
  s = 1.0;
  if (0.0 < dof) {
    bound = dof;
    xlam = xx;
    _status = dof;
    dof_local = xx;
    cdft((int *)((long)&p + 4),&q,&s,&xlam,&bound,(int *)&p,&local_58);
    xx_local = q;
    pq.p = s;
  }
  pVar1.q = pq.p;
  pVar1.p = xx_local;
  return pVar1;
}

Assistant:

static pqpair student_s2pq( double xx , double dof )
{
   int which , status ;
   double p,q, s,xlam,bound ;
   pqpair pq={0.0,1.0} ;

   which  = 1 ;
   p      = 0.0 ;
   q      = 1.0 ;
   s      = xx ;
   xlam   = dof ;  if( xlam <= 0.0 ) return pq ;

   cdft( &which , &p , &q , &s , &xlam , &status , &bound ) ;
   pq.p = p ; pq.q = q ; return pq ;
}